

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

shared_ptr<const_void> __thiscall pstore::storage::segment_base(storage *this,segment_type segment)

{
  segment_type in_DX;
  undefined6 in_register_00000032;
  shared_ptr<const_void> sVar1;
  segment_type segment_local;
  storage *this_local;
  
  sVar1 = segment_base_impl<pstore::storage_const,std::shared_ptr<void_const>>
                    (this,(storage *)CONCAT62(in_register_00000032,segment),in_DX);
  sVar1.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<const_void>)sVar1.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<void const>
        segment_base (address::segment_type const segment) const noexcept {
            return segment_base_impl (*this, segment);
        }